

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

ByteString * operator^(ByteString *lhs,ByteString *rhs)

{
  unsigned_long *puVar1;
  uchar *puVar2;
  ByteString *in_RDI;
  size_t i;
  size_t xorLen;
  ByteString *rv;
  undefined7 in_stack_ffffffffffffff98;
  uchar in_stack_ffffffffffffff9f;
  ulong local_40;
  size_t local_30;
  size_t local_28;
  unsigned_long local_20;
  
  local_28 = ByteString::size((ByteString *)0x1c554a);
  local_30 = ByteString::size((ByteString *)0x1c5559);
  puVar1 = std::min<unsigned_long>(&local_28,&local_30);
  local_20 = *puVar1;
  ByteString::ByteString((ByteString *)0x1c5584);
  for (local_40 = 0; local_40 < local_20; local_40 = local_40 + 1) {
    puVar2 = ByteString::const_byte_str
                       ((ByteString *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98))
    ;
    in_stack_ffffffffffffff9f = puVar2[local_40];
    ByteString::const_byte_str
              ((ByteString *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    ByteString::operator+=(in_RDI,in_stack_ffffffffffffff9f);
  }
  return in_RDI;
}

Assistant:

ByteString operator^(const ByteString& lhs, const ByteString& rhs)
{
	size_t xorLen = std::min(lhs.size(), rhs.size());
	ByteString rv;

	for (size_t i = 0; i < xorLen; i++)
	{
		rv += lhs.const_byte_str()[i] ^ rhs.const_byte_str()[i];
	}

	return rv;
}